

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

refs_t * refs_create(void)

{
  refs_t *r;
  string_alloc_t *psVar1;
  kh_refs_t *pkVar2;
  
  r = (refs_t *)calloc(1,0x70);
  if (r != (refs_t *)0x0) {
    psVar1 = string_pool_create(0x2000);
    r->pool = psVar1;
    if (psVar1 != (string_alloc_t *)0x0) {
      r->count = 1;
      r->last_id = -1;
      pkVar2 = (kh_refs_t *)calloc(1,0x28);
      r->h_meta = pkVar2;
      if (pkVar2 != (kh_refs_t *)0x0) {
        pthread_mutex_init((pthread_mutex_t *)&r->lock,(pthread_mutexattr_t *)0x0);
        return r;
      }
    }
    refs_free(r);
  }
  return (refs_t *)0x0;
}

Assistant:

static refs_t *refs_create(void) {
    refs_t *r = calloc(1, sizeof(*r));

    RP("refs_create()\n");

    if (!r)
	return NULL;

    if (!(r->pool = string_pool_create(8192)))
	goto err;

    r->ref_id = NULL; // see refs2id() to populate.
    r->count = 1;
    r->last = NULL;
    r->last_id = -1;

    if (!(r->h_meta = kh_init(refs)))
	goto err;

    pthread_mutex_init(&r->lock, NULL);

    return r;

 err:
    refs_free(r);
    return NULL;
}